

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

BIND_FLAGS Diligent::SwapChainUsageFlagsToBindFlags(SWAP_CHAIN_USAGE_FLAGS SwapChainUsage)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  BIND_FLAGS local_10;
  SWAP_CHAIN_USAGE_FLAGS SCUsageBit;
  BIND_FLAGS BindFlags;
  SWAP_CHAIN_USAGE_FLAGS SwapChainUsage_local;
  
  local_10 = BIND_NONE;
  SCUsageBit = SwapChainUsage;
  while (SCUsageBit != SWAP_CHAIN_USAGE_NONE) {
    msg.field_2._12_4_ = ExtractLSB<Diligent::SWAP_CHAIN_USAGE_FLAGS>(&SCUsageBit);
    switch(msg.field_2._12_4_) {
    case 1:
      operator|=(&local_10,BIND_RENDER_TARGET);
      break;
    case 2:
      operator|=(&local_10,BIND_SHADER_RESOURCE);
      break;
    default:
      FormatString<char[33]>((string *)local_38,(char (*) [33])"Unexpected swap chain usage flag");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"SwapChainUsageFlagsToBindFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x762);
      std::__cxx11::string::~string((string *)local_38);
      break;
    case 4:
      operator|=(&local_10,BIND_INPUT_ATTACHMENT);
      break;
    case 8:
    }
  }
  return local_10;
}

Assistant:

BIND_FLAGS SwapChainUsageFlagsToBindFlags(SWAP_CHAIN_USAGE_FLAGS SwapChainUsage)
{
    BIND_FLAGS BindFlags = BIND_NONE;
    static_assert(SWAP_CHAIN_USAGE_LAST == 8, "Did you add a new swap chain usage flag? Please handle it here.");
    while (SwapChainUsage != SWAP_CHAIN_USAGE_NONE)
    {
        SWAP_CHAIN_USAGE_FLAGS SCUsageBit = ExtractLSB(SwapChainUsage);
        switch (SCUsageBit)
        {
            case SWAP_CHAIN_USAGE_RENDER_TARGET:
                BindFlags |= BIND_RENDER_TARGET;
                break;

            case SWAP_CHAIN_USAGE_SHADER_RESOURCE:
                BindFlags |= BIND_SHADER_RESOURCE;
                break;

            case SWAP_CHAIN_USAGE_INPUT_ATTACHMENT:
                BindFlags |= BIND_INPUT_ATTACHMENT;
                break;

            case SWAP_CHAIN_USAGE_COPY_SOURCE:
                // No special bind flag needed
                break;

            default:
                UNEXPECTED("Unexpected swap chain usage flag");
        }
    }
    return BindFlags;
}